

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void blendvpd_(PDISASM pMyDisasm)

{
  byte *pbVar1;
  UInt8 UVar2;
  byte *pbVar3;
  byte *pbVar4;
  undefined8 uVar5;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    UVar2 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar2 == '\x02') {
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        (pMyDisasm->Instruction).Category = 0x140000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpmovusqd",10);
        (pMyDisasm->Reserved_).EVEX.tupletype = '\f';
        vex_ExG(pMyDisasm,3,4,9,4,4,4);
        return;
      }
    }
    else if (UVar2 == '\x01') {
      uVar5 = 0x64766c6f727076;
      if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
        uVar5 = 0x71766c6f727076;
      }
      (pMyDisasm->Instruction).Category = 0x140000;
      *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar5;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      ArgsVEX(pMyDisasm);
      return;
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x70;
      (pMyDisasm->Instruction).Category = 0x80021;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"blendvpd",9);
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Operand1).AccessMode = 3;
      (pMyDisasm->Operand3).AccessMode = 1;
      (pMyDisasm->Operand3).OpType = 0x20000;
      (pMyDisasm->Operand3).Registers.type = 4;
      (pMyDisasm->Operand3).Registers.xmm = 1;
      (pMyDisasm->Operand3).OpSize = 0x80;
      strcpy((pMyDisasm->Operand3).OpMnemonic,RegistersSSE[0]);
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      return;
    }
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    (pMyDisasm->Instruction).Category = 0x110002;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vblendvpd",10);
    if ((pMyDisasm->Reserved_).VEX.L == '\0') {
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0xd1;
    }
    else {
      (pMyDisasm->Reserved_).Register_ = 8;
      (pMyDisasm->Reserved_).MemDecoration = 0xd2;
    }
    GyEy(pMyDisasm);
    pbVar3 = (byte *)(pMyDisasm->Reserved_).EIP_;
    pbVar4 = (byte *)(pMyDisasm->Reserved_).EndOfBlock;
    pbVar1 = pbVar3 + 1;
    (pMyDisasm->Reserved_).EIP_ = (UIntPtr)pbVar1;
    if (pbVar4 < pbVar1 && pbVar4 != (byte *)0x0) {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
      return;
    }
    fillRegister((uint)(*pbVar3 >> 4),&pMyDisasm->Operand4,pMyDisasm);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ blendvpd_(PDISASM pMyDisasm)
{
 UInt8 Imm8;
 if (GV.EVEX.state == InUsePrefix) {
   if (GV.VEX.pp == 1) {
     if (GV.EVEX.W == 1) {
       pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vprolvq");
       #endif
     }
     else {
       pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vprolvd");
       #endif
     }
     GV.EVEX.tupletype = FULL;
     ArgsVEX(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     if (GV.EVEX.W == 0) {
       if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
       pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmovusqd");
       #endif
       GV.EVEX.tupletype = HALF_MEM;
       vex_ExG(pMyDisasm, Arg1dword, Arg1qword, Arg1_m128_xmm, SSE_REG, SSE_REG, SSE_REG);
     }
     else {
       failDecode(pMyDisasm);
     }
   }
   else {
     failDecode(pMyDisasm);
   }
 }

   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
     if (GV.VEX.state == InUsePrefix) {
       GV.ERROR_OPCODE = UD_;
       pMyDisasm->Instruction.Category = AVX_INSTRUCTION+ARITHMETIC_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vblendvpd");
       #endif
      if (GV.REX.W_ == 0x1) GV.ERROR_OPCODE = UD_;
       if (GV.VEX.L == 0) {
         GV.Register_ = SSE_REG;
         GV.MemDecoration = Arg3_m128_xmm;
         GyEy(pMyDisasm);
         GV.EIP_++;
         if (!Security(0, pMyDisasm)) return;
         Imm8 = *((UInt8*) (GV.EIP_- 1));
         fillRegister((Imm8 >> 4) & 0xF, &pMyDisasm->Operand4, pMyDisasm);
       }
       else {
         GV.Register_ = AVX_REG;
         GV.MemDecoration = Arg3_m256_ymm;
         GyEy(pMyDisasm);
         GV.EIP_++;
         if (!Security(0, pMyDisasm)) return;
         Imm8 = *((UInt8*) (GV.EIP_- 1));
         fillRegister((Imm8 >> 4) & 0xF, &pMyDisasm->Operand4, pMyDisasm);
       }
     }
     else {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       GV.MemDecoration = Arg2_m128d_xmm;
       pMyDisasm->Instruction.Category = SSE41_INSTRUCTION+PACKED_BLENDING_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "blendvpd");
       #endif
       GV.Register_ = SSE_REG;
       pMyDisasm->Operand1.AccessMode = READ + WRITE;
       pMyDisasm->Operand3.AccessMode = READ;
       pMyDisasm->Operand3.OpType = REGISTER_TYPE;
       pMyDisasm->Operand3.Registers.type = SSE_REG;
       pMyDisasm->Operand3.Registers.xmm = REG0;
       pMyDisasm->Operand3.OpSize = 128;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy ((char*) pMyDisasm->Operand3.OpMnemonic, RegistersSSE[0]);
       #endif
       GxEx(pMyDisasm);

     }
   }
   else {
       failDecode(pMyDisasm);
   }

}